

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O2

string * __thiscall
glcts::GeometryShaderMaxImageUniformsTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderMaxImageUniformsTest *this)

{
  ostream *poVar1;
  GLint n_img_1;
  GLint n_img;
  int iVar2;
  char *gs_code_raw;
  string gs_code;
  stringstream code_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&code_sstream);
  std::operator<<(&local_1a8,
                  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nprecision highp iimage2D;\n\nivec4 counter = ivec4(0);\n\n"
                 );
  for (iVar2 = 0; iVar2 < this->m_gl_max_geometry_image_uniforms_ext_value; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"layout(binding = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,", r32i) uniform iimage2D img");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(&local_1a8,"\nvoid main()\n{\n");
  for (iVar2 = 0; iVar2 < this->m_gl_max_geometry_image_uniforms_ext_value; iVar2 = iVar2 + 1) {
    poVar1 = std::operator<<(&local_1a8,"    counter += imageLoad(img");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,", ivec2(0, 0));\n");
  }
  std::operator<<(&local_1a8,
                  "\n    gl_Position = vec4(float(counter.x), 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  gs_code_raw = gs_code._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&gs_code_raw);
  std::__cxx11::string::~string((string *)&gs_code);
  std::__cxx11::stringstream::~stringstream((stringstream *)&code_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderMaxImageUniformsTest::getGSCode()
{
	std::stringstream code_sstream;

	/* Form the GS */
	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout (points)                   in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"precision highp iimage2D;\n"
					"\n"
					"ivec4 counter = ivec4(0);\n"
					"\n";

	for (glw::GLint n_img = 0; n_img < (m_gl_max_geometry_image_uniforms_ext_value); ++n_img)
	{
		code_sstream << "layout(binding = " << n_img << ", r32i) uniform iimage2D img" << n_img << ";\n";
	}

	code_sstream << "\n"
					"void main()\n"
					"{\n";

	for (glw::GLint n_img = 0; n_img < (m_gl_max_geometry_image_uniforms_ext_value); ++n_img)
	{
		code_sstream << "    counter += imageLoad(img" << n_img << ", ivec2(0, 0));\n";
	}

	code_sstream << "\n"
					"    gl_Position = vec4(float(counter.x), 0.0, 0.0, 1.0);\n"
					"    EmitVertex();\n"
					"}\n";

	/* Form a specialized version of the GS source code */
	std::string gs_code				= code_sstream.str();
	const char* gs_code_raw			= gs_code.c_str();
	std::string gs_code_specialized = specializeShader(1 /* parts */, &gs_code_raw);

	return gs_code_specialized;
}